

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.cpp
# Opt level: O0

void __thiscall gui::Gui::draw(Gui *this)

{
  RenderTarget *in_stack_00000048;
  Gui *in_stack_00000050;
  undefined1 in_stack_00000060 [104];
  
  draw(in_stack_00000050,in_stack_00000048,(RenderStates)in_stack_00000060);
  return;
}

Assistant:

void Gui::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (redrawPending_) {
        GUI_DEBUG << "Gui redraw...\n";
        renderTexture_.clear({0, 0, 0, 0});
        for (const auto& child : getChildren()) {
            renderTexture_.draw(*child);
        }
        renderTexture_.display();
        redrawPending_ = false;
    }

    target.draw(renderSprite_, states);
}